

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VaryingOutputCountCase::genVertexAttribData
          (VaryingOutputCountCase *this)

{
  VaryingOutputCountCase *this_local;
  
  if (this->m_mode == MODE_WITHOUT_INSTANCING) {
    genVertexDataWithoutInstancing(this);
  }
  else if (this->m_mode == MODE_WITH_INSTANCING) {
    genVertexDataWithInstancing(this);
  }
  return;
}

Assistant:

void VaryingOutputCountCase::genVertexAttribData (void)
{
	if (m_mode == MODE_WITHOUT_INSTANCING)
		genVertexDataWithoutInstancing();
	else if (m_mode == MODE_WITH_INSTANCING)
		genVertexDataWithInstancing();
	else
		DE_ASSERT(false);
}